

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

void vector_push_front_empty(vector v)

{
  ulong uVar1;
  void *__src;
  int iVar2;
  ulong uVar3;
  void *__dest;
  
  if (v != (vector)0x0) {
    if ((v->size == v->capacity) && (iVar2 = vector_reserve(v,v->capacity * 2), iVar2 != 0)) {
      log_write_impl_va("metacall",0x156,"vector_push_front_empty",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
    }
    uVar1 = v->type_size;
    __src = v->data;
    if (__src == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      uVar3 = v->capacity * uVar1;
      __dest = (void *)0x0;
      if (uVar1 <= uVar3 && uVar3 - uVar1 != 0) {
        __dest = (void *)((long)__src + uVar1);
      }
    }
    memmove(__dest,__src,uVar1 * v->size);
    v->size = v->size + 1;
  }
  return;
}

Assistant:

void vector_push_front_empty(vector v)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		memmove(vector_data_offset_bytes(v, v->type_size), v->data, v->size * v->type_size);

		++v->size;
	}
}